

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::
Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>::populate
          (Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
           *this,unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *val)

{
  unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *in_stack_00000008;
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
  *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
            (in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>::
  ~GeneratorWrapper((GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
                     *)0x444f89);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }